

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFilesGenerator::GenerateScriptActions
          (cmInstallFilesGenerator *this,ostream *os,Indent indent)

{
  string local_48;
  
  if ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions((cmScriptGenerator *)this,os,indent);
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  AddFilesInstallRule(this,os,&local_48,indent,&this->Files);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptActions(std::ostream& os,
                                                    Indent indent)
{
  if (this->ActionsPerConfig) {
    this->cmInstallGenerator::GenerateScriptActions(os, indent);
  } else {
    this->AddFilesInstallRule(os, "", indent, this->Files);
  }
}